

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef lj_opt_fwd_xload(jit_State *J)

{
  byte bVar1;
  ushort uVar2;
  IRRef op2;
  uint uVar3;
  TRef TVar4;
  AliasRet AVar5;
  IRIns IVar6;
  byte bVar7;
  long lVar8;
  IRRef1 *pIVar9;
  ushort uVar10;
  ulong uVar11;
  uint uVar12;
  IRIns *pIVar13;
  uint64_t u64;
  IRIns *pIVar14;
  uint uVar15;
  uint uVar16;
  IRIns *local_40;
  
  uVar2 = (J->fold).ins.field_0.op1;
  uVar11 = (ulong)uVar2;
  uVar3 = (uint)uVar2;
  pIVar14 = (J->cur).ir;
  local_40 = pIVar14 + uVar11;
  uVar10 = (J->fold).ins.field_0.op2;
  if ((uVar10 & 1) != 0) {
    uVar15 = (uint)uVar2;
    goto LAB_00151589;
  }
  if ((uVar10 & 2) != 0) {
LAB_001517a1:
    TVar4 = lj_ir_emit(J);
    return TVar4;
  }
  uVar2 = J->chain[0x4e];
  do {
    uVar12 = (uint)uVar2;
    uVar3 = (uint)uVar11;
    uVar16 = (uint)J->chain[99];
    if (J->chain[99] < uVar3) {
      uVar16 = uVar3;
    }
    if (uVar16 <= J->chain[0x5a]) {
      uVar16 = (uint)J->chain[0x5a];
    }
    while (uVar15 = uVar16, uVar16 < uVar12) {
      pIVar13 = pIVar14 + uVar12;
      AVar5 = aa_xref(J,local_40,&(J->fold).ins,pIVar13);
      uVar15 = uVar12;
      if (AVar5 == ALIAS_MAY) break;
      if (AVar5 == ALIAS_MUST) {
        bVar7 = *(byte *)((long)&(J->fold).ins + 4);
        bVar1 = *(byte *)((long)pIVar14 + (ulong)(pIVar13->field_0).op2 * 8 + 4);
        if (((bVar1 ^ bVar7) & 0x1f) == 0) {
          return (uint)(pIVar13->field_0).op2;
        }
        uVar2 = bVar7 & 0x1f;
        if ((uVar2 == 0x11) || (uVar2 == 0xf)) {
          uVar10 = 0x13;
          uVar2 = uVar2 | 0x800;
        }
        else {
          uVar10 = 0x13;
          if ((bVar7 & 0x1d) != 0x10) {
            uVar10 = uVar2;
            uVar2 = bVar1 & 0x1f;
          }
        }
        (J->fold).ins.field_0.ot = uVar10 + 0x5b00;
        (J->fold).ins.field_0.op1 = (pIVar13->field_0).op2;
        (J->fold).ins.field_0.op2 = uVar10 << 5 | uVar2;
        return 1;
      }
      uVar12 = (uint)(pIVar13->field_0).prev;
    }
LAB_00151589:
    pIVar9 = J->chain + 0x46;
    while( true ) {
      uVar2 = *pIVar9;
      if (uVar2 <= uVar15) break;
      pIVar13 = pIVar14 + (uint)uVar2;
      if ((uVar3 == (pIVar13->field_0).op1) &&
         ((((J->fold).ins.field_1.t.irt ^ (pIVar13->field_1).t.irt) & 0x1f) == 0)) {
        return (uint)uVar2;
      }
      pIVar9 = &(pIVar13->field_0).prev;
    }
    if ((((((ulong)(J->fold).ins & 0x10000) != 0) || (J->chain[0x11] == 0)) ||
        (uVar3 != (J->fold).ins.field_0.op1)) || ((local_40->field_1).o != ')')) goto LAB_001517a1;
    lVar8 = (long)(short)(local_40->field_0).op2;
    IVar6 = (IRIns)0x0;
    if (-1 < lVar8) {
      if (*(char *)((long)pIVar14 + lVar8 * 8 + 5) == '\x1d') {
        IVar6 = pIVar14[lVar8 + 1];
      }
      else {
        IVar6 = (IRIns)(long)pIVar14[lVar8].i;
      }
      local_40 = pIVar14 + (local_40->field_0).op1;
      if ((local_40->field_1).o != ')') goto LAB_001517a1;
    }
    pIVar13 = pIVar14 + (local_40->field_0).op1;
    if ((pIVar13->field_1).o == ')') {
      bVar7 = 1;
      if ((pIVar13->field_0).op1 != (pIVar13->field_0).op2) goto LAB_0015166e;
    }
    else if (((pIVar13->field_1).o == '$') && (-1 < (long)(short)(pIVar13->field_0).op2)) {
      bVar7 = (byte)pIVar14[(short)(pIVar13->field_0).op2].field_1.op12;
    }
    else {
LAB_0015166e:
      bVar7 = 0;
      pIVar13 = local_40;
    }
    uVar11 = (ulong)(pIVar13->field_0).op1;
    if (((*(char *)((long)pIVar14 + uVar11 * 8 + 5) != ')') ||
        ((*(byte *)((long)pIVar14 + uVar11 * 8 + 4) & 0x1f) != 0x13)) ||
       (lVar8 = (long)*(short *)((long)pIVar14 + uVar11 * 8 + 2), lVar8 < 0)) goto LAB_001517a1;
    u64 = ((long)pIVar14[lVar8].i << (bVar7 & 0x3f)) + (long)IVar6;
    op2 = (IRRef)pIVar14[uVar11].field_0.op1;
    if (pIVar13 != local_40) {
      if ((pIVar13->field_1).o == IR_BSHL) {
        op2 = (IRRef)(pIVar13->field_0).op2;
      }
      op2 = reassoc_trycse(J,(uint)(pIVar13->field_1).o,(uint)pIVar14[uVar11].field_0.op1,op2);
      if (op2 == 0) goto LAB_001517a1;
    }
    uVar3 = reassoc_trycse(J,IR_ADD,op2,(uint)(local_40->field_0).op2);
    if (uVar3 == 0) goto LAB_001517a1;
    if (u64 != 0) {
      TVar4 = lj_ir_kint64(J,u64);
      uVar3 = reassoc_trycse(J,IR_ADD,uVar3,TVar4 & 0xffff);
      if (uVar3 == 0) goto LAB_001517a1;
    }
    uVar11 = (ulong)uVar3;
    pIVar9 = J->chain + 0x4e;
    pIVar14 = (J->cur).ir;
    while( true ) {
      uVar2 = *pIVar9;
      if (uVar2 <= uVar15) break;
      pIVar9 = (IRRef1 *)((long)pIVar14 + (ulong)(uint)uVar2 * 8 + 6);
    }
    local_40 = pIVar14 + uVar11;
  } while( true );
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_xload(jit_State *J)
{
  IRRef xref = fins->op1;
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  if ((fins->op2 & IRXLOAD_READONLY))
    goto cselim;
  if ((fins->op2 & IRXLOAD_VOLATILE))
    goto doemit;

  /* Search for conflicting stores. */
  ref = J->chain[IR_XSTORE];
retry:
  if (J->chain[IR_CALLXS] > lim) lim = J->chain[IR_CALLXS];
  if (J->chain[IR_XBAR] > lim) lim = J->chain[IR_XBAR];
  while (ref > lim) {
    IRIns *store = IR(ref);
    switch (aa_xref(J, xr, fins, store)) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST:
      /* Emit conversion if the loaded type doesn't match the forwarded type. */
      if (!irt_sametype(fins->t, IR(store->op2)->t)) {
	IRType dt = irt_type(fins->t), st = irt_type(IR(store->op2)->t);
	if (dt == IRT_I8 || dt == IRT_I16) {  /* Trunc + sign-extend. */
	  st = dt | IRCONV_SEXT;
	  dt = IRT_INT;
	} else if (dt == IRT_U8 || dt == IRT_U16) {  /* Trunc + zero-extend. */
	  st = dt;
	  dt = IRT_INT;
	}
	fins->ot = IRT(IR_CONV, dt);
	fins->op1 = store->op2;
	fins->op2 = (dt<<5)|st;
	return RETRYFOLD;
      }
      return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[IR_XLOAD];
  while (ref > lim) {
    /* CSE for XLOAD depends on the type, but not on the IRXLOAD_* flags. */
    if (IR(ref)->op1 == xref && irt_sametype(IR(ref)->t, fins->t))
      return ref;
    ref = IR(ref)->prev;
  }

  /* Reassociate XLOAD across PHIs to handle a[i-1] forwarding case. */
  if (!(fins->op2 & IRXLOAD_READONLY) && J->chain[IR_LOOP] &&
      xref == fins->op1 && (xref = reassoc_xref(J, xr)) != 0) {
    ref = J->chain[IR_XSTORE];
    while (ref > lim)  /* Skip stores that have already been checked. */
      ref = IR(ref)->prev;
    lim = xref;
    xr = IR(xref);
    goto retry;  /* Retry with the reassociated reference. */
  }
doemit:
  return EMITFOLD;
}